

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spl_inl.h
# Opt level: O2

int16_t WebRtcSpl_NormW32(int32_t a)

{
  short sVar1;
  short sVar2;
  
  if (a != 0) {
    sVar2 = (ushort)((uint)a < 0x8000) * 0x10;
    sVar1 = sVar2 + 8;
    if (0x7fffff < (uint)(a << (sbyte)sVar2)) {
      sVar1 = sVar2;
    }
    sVar2 = sVar1 + 4;
    if (0x7ffffff < (uint)(a << ((byte)sVar1 & 0x1f))) {
      sVar2 = sVar1;
    }
    sVar1 = sVar2 + 2;
    if (0x1fffffff < (uint)(a << ((byte)sVar2 & 0x1f))) {
      sVar1 = sVar2;
    }
    return sVar1 + (ushort)((uint)(a << ((byte)sVar1 & 0x1f)) < 0x40000000);
  }
  return 0;
}

Assistant:

static __inline int16_t WebRtcSpl_NormW32(int32_t a) {
  int16_t zeros;

  if (a == 0) {
    return 0;
  }
  else if (a < 0) {
    a = ~a;
  }

  if (!(0xFFFF8000 & a)) {
    zeros = 16;
  } else {
    zeros = 0;
  }
  if (!(0xFF800000 & (a << zeros))) zeros += 8;
  if (!(0xF8000000 & (a << zeros))) zeros += 4;
  if (!(0xE0000000 & (a << zeros))) zeros += 2;
  if (!(0xC0000000 & (a << zeros))) zeros += 1;

  return zeros;
}